

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store_array_elt(XMLWriter *this,Vec3f *v)

{
  ostream *poVar1;
  void *this_00;
  float *in_RSI;
  long in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x10),*in_RSI);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1," ");
  this_00 = (void *)std::ostream::operator<<(poVar1,in_RSI[2]);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void XMLWriter::store_array_elt(const Vec3f& v) {
    xml << v.x << " " << v.y << " " << v.z << std::endl;
  }